

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

void __thiscall
LLVMBC::GetElementPtrInst::GetElementPtrInst
          (GetElementPtrInst *this,Type *pointer_type,Vector<Value_*> *indices,bool inbounds_)

{
  vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_> local_40;
  byte local_21;
  Vector<Value_*> *pVStack_20;
  bool inbounds__local;
  Vector<Value_*> *indices_local;
  Type *pointer_type_local;
  GetElementPtrInst *this_local;
  
  local_21 = inbounds_;
  pVStack_20 = indices;
  indices_local = (Vector<Value_*> *)pointer_type;
  pointer_type_local = (Type *)this;
  Instruction::Instruction(&this->super_Instruction,pointer_type,GetElementPtr);
  this->inbounds = (bool)(local_21 & 1);
  std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::vector
            (&local_40,indices);
  Instruction::set_operands(&this->super_Instruction,&local_40);
  std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::~vector(&local_40)
  ;
  return;
}

Assistant:

GetElementPtrInst::GetElementPtrInst(Type *pointer_type, Vector<Value *> indices, bool inbounds_)
    : Instruction(pointer_type, ValueKind::GetElementPtr)
    , inbounds(inbounds_)
{
	set_operands(std::move(indices));
}